

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureFileCommand.cxx
# Opt level: O0

bool __thiscall
cmConfigureFileCommand::InitialPass
          (cmConfigureFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  char *pcVar4;
  char *pcVar5;
  ostream *poVar6;
  const_reference pvVar7;
  ulong uVar8;
  allocator local_351;
  string local_350;
  allocator local_329;
  undefined1 local_328 [8];
  string msg;
  string local_300;
  uint local_2dc;
  string local_2d8 [4];
  uint i;
  string unknown_args;
  undefined1 local_2b0 [8];
  string errorMessage;
  undefined1 local_270 [8];
  string e_1;
  string local_248;
  string local_228;
  char *local_208;
  char *outFile;
  ostringstream local_1e0 [8];
  ostringstream e;
  char *inFile;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmConfigureFileCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments, expected 2",&local_49
              );
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local,0);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar4);
    if (!bVar1) {
      pcVar5 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::operator=((string *)&this->InputFile,pcVar5);
      std::__cxx11::string::operator+=((string *)&this->InputFile,"/");
    }
    std::__cxx11::string::operator+=((string *)&this->InputFile,pcVar4);
    bVar1 = cmsys::SystemTools::FileIsDirectory(&this->InputFile);
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_1e0);
      poVar6 = std::operator<<((ostream *)local_1e0,"input location\n");
      poVar6 = std::operator<<(poVar6,"  ");
      poVar6 = std::operator<<(poVar6,(string *)&this->InputFile);
      poVar6 = std::operator<<(poVar6,"\n");
      std::operator<<(poVar6,"is a directory but a file was expected.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&outFile);
      std::__cxx11::string::~string((string *)&outFile);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1e0);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local,1);
      local_208 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmsys::SystemTools::FileIsFullPath(local_208);
      if (!bVar1) {
        pcVar5 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
        std::__cxx11::string::operator=((string *)&this->OutputFile,pcVar5);
        std::__cxx11::string::operator+=((string *)&this->OutputFile,"/");
      }
      std::__cxx11::string::operator+=((string *)&this->OutputFile,local_208);
      bVar1 = cmsys::SystemTools::FileIsDirectory(&this->OutputFile);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)&this->OutputFile,"/");
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_248,pcVar4,(allocator *)(e_1.field_2._M_local_buf + 0xf));
        cmsys::SystemTools::GetFilenameName(&local_228,&local_248);
        std::__cxx11::string::operator+=((string *)&this->OutputFile,(string *)&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_248);
        std::allocator<char>::~allocator((allocator<char> *)(e_1.field_2._M_local_buf + 0xf));
      }
      this_00 = (this->super_cmCommand).Makefile;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmMakefile::CanIWriteThisFile(this_00,pcVar4);
      if (bVar1) {
        std::__cxx11::string::string((string *)local_2b0);
        bVar1 = cmNewLineStyle::ReadFromArguments
                          (&this->NewLineStyle,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_2_local,(string *)local_2b0);
        if (bVar1) {
          this->CopyOnly = false;
          this->EscapeQuotes = false;
          std::__cxx11::string::string(local_2d8);
          this->AtOnly = false;
          for (local_2dc = 2; uVar8 = (ulong)local_2dc,
              sVar3 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)param_2_local), uVar8 < sVar3; local_2dc = local_2dc + 1) {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,(ulong)local_2dc);
            bVar1 = std::operator==(pvVar7,"COPYONLY");
            if (bVar1) {
              this->CopyOnly = true;
              bVar1 = cmNewLineStyle::IsValid(&this->NewLineStyle);
              if (bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_300,
                           "COPYONLY could not be used in combination with NEWLINE_STYLE",
                           (allocator *)(msg.field_2._M_local_buf + 0xf));
                cmCommand::SetError(&this->super_cmCommand,&local_300);
                std::__cxx11::string::~string((string *)&local_300);
                std::allocator<char>::~allocator
                          ((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
                this_local._7_1_ = 0;
                goto LAB_004d69ff;
              }
            }
            else {
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_2_local,(ulong)local_2dc);
              bVar1 = std::operator==(pvVar7,"ESCAPE_QUOTES");
              if (bVar1) {
                this->EscapeQuotes = true;
              }
              else {
                pvVar7 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)param_2_local,(ulong)local_2dc);
                bVar1 = std::operator==(pvVar7,"@ONLY");
                if (bVar1) {
                  this->AtOnly = true;
                }
                else {
                  pvVar7 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)param_2_local,(ulong)local_2dc);
                  bVar1 = std::operator==(pvVar7,"IMMEDIATE");
                  if (!bVar1) {
                    pvVar7 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)param_2_local,(ulong)local_2dc);
                    bVar1 = std::operator==(pvVar7,"NEWLINE_STYLE");
                    if (!bVar1) {
                      pvVar7 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)param_2_local,(ulong)local_2dc);
                      bVar1 = std::operator==(pvVar7,"LF");
                      if (!bVar1) {
                        pvVar7 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)param_2_local,(ulong)local_2dc);
                        bVar1 = std::operator==(pvVar7,"UNIX");
                        if (!bVar1) {
                          pvVar7 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)param_2_local,(ulong)local_2dc);
                          bVar1 = std::operator==(pvVar7,"CRLF");
                          if (!bVar1) {
                            pvVar7 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,(ulong)local_2dc);
                            bVar1 = std::operator==(pvVar7,"WIN32");
                            if (!bVar1) {
                              pvVar7 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,(ulong)local_2dc);
                              bVar1 = std::operator==(pvVar7,"DOS");
                              if (!bVar1) {
                                std::__cxx11::string::operator+=(local_2d8," ");
                                pvVar7 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,(ulong)local_2dc);
                                std::__cxx11::string::operator+=(local_2d8,(string *)pvVar7);
                                std::__cxx11::string::operator+=(local_2d8,"\n");
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)local_328,"configure_file called with unknown argument(s):\n",
                       &local_329);
            std::allocator<char>::~allocator((allocator<char> *)&local_329);
            std::__cxx11::string::operator+=((string *)local_328,local_2d8);
            cmMakefile::IssueMessage
                      ((this->super_cmCommand).Makefile,AUTHOR_WARNING,(string *)local_328,false);
            std::__cxx11::string::~string((string *)local_328);
          }
          iVar2 = ConfigureFile(this);
          if (iVar2 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_350,"Problem configuring file",&local_351)
            ;
            cmCommand::SetError(&this->super_cmCommand,&local_350);
            std::__cxx11::string::~string((string *)&local_350);
            std::allocator<char>::~allocator((allocator<char> *)&local_351);
            this_local._7_1_ = 0;
          }
          else {
            this_local._7_1_ = 1;
          }
LAB_004d69ff:
          unknown_args.field_2._12_4_ = 1;
          std::__cxx11::string::~string(local_2d8);
        }
        else {
          cmCommand::SetError(&this->super_cmCommand,(string *)local_2b0);
          this_local._7_1_ = 0;
          unknown_args.field_2._12_4_ = 1;
        }
        std::__cxx11::string::~string((string *)local_2b0);
      }
      else {
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&errorMessage.field_2 + 8);
        std::operator+(__return_storage_ptr__,"attempted to configure a file: ",&this->OutputFile);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_270,__return_storage_ptr__," into a source directory.");
        std::__cxx11::string::~string((string *)(errorMessage.field_2._M_local_buf + 8));
        cmCommand::SetError(&this->super_cmCommand,(string *)local_270);
        cmSystemTools::SetFatalErrorOccured();
        this_local._7_1_ = 0;
        std::__cxx11::string::~string((string *)local_270);
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmConfigureFileCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments, expected 2");
    return false;
    }

  const char* inFile = args[0].c_str();
  if(!cmSystemTools::FileIsFullPath(inFile))
    {
    this->InputFile = this->Makefile->GetCurrentSourceDirectory();
    this->InputFile += "/";
    }
  this->InputFile += inFile;

  // If the input location is a directory, error out.
  if(cmSystemTools::FileIsDirectory(this->InputFile))
    {
    std::ostringstream e;
    e << "input location\n"
      << "  " << this->InputFile << "\n"
      << "is a directory but a file was expected.";
    this->SetError(e.str());
    return false;
    }

  const char* outFile = args[1].c_str();
  if(!cmSystemTools::FileIsFullPath(outFile))
    {
    this->OutputFile = this->Makefile->GetCurrentBinaryDirectory();
    this->OutputFile += "/";
    }
  this->OutputFile += outFile;

  // If the output location is already a directory put the file in it.
  if(cmSystemTools::FileIsDirectory(this->OutputFile))
    {
    this->OutputFile += "/";
    this->OutputFile += cmSystemTools::GetFilenameName(inFile);
    }

  if ( !this->Makefile->CanIWriteThisFile(this->OutputFile.c_str()) )
    {
    std::string e = "attempted to configure a file: " + this->OutputFile
      + " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
    }
  std::string errorMessage;
  if (!this->NewLineStyle.ReadFromArguments(args, errorMessage))
    {
    this->SetError(errorMessage);
    return false;
    }
  this->CopyOnly = false;
  this->EscapeQuotes = false;

  std::string unknown_args;
  this->AtOnly = false;
  for(unsigned int i=2;i < args.size();++i)
    {
    if(args[i] == "COPYONLY")
      {
      this->CopyOnly = true;
      if (this->NewLineStyle.IsValid())
        {
        this->SetError("COPYONLY could not be used in combination "
                       "with NEWLINE_STYLE");
        return false;
        }
      }
    else if(args[i] == "ESCAPE_QUOTES")
      {
      this->EscapeQuotes = true;
      }
    else if(args[i] == "@ONLY")
      {
      this->AtOnly = true;
      }
    else if(args[i] == "IMMEDIATE")
      {
      /* Ignore legacy option.  */
      }
    else if(args[i] == "NEWLINE_STYLE" ||
            args[i] == "LF" || args[i] == "UNIX" ||
            args[i] == "CRLF" || args[i] == "WIN32" ||
            args[i] == "DOS")
      {
      /* Options handled by NewLineStyle member above.  */
      }
    else
      {
      unknown_args += " ";
      unknown_args += args[i];
      unknown_args += "\n";
      }
    }
  if (!unknown_args.empty())
    {
    std::string msg = "configure_file called with unknown argument(s):\n";
    msg += unknown_args;
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, msg);
    }

  if ( !this->ConfigureFile() )
    {
    this->SetError("Problem configuring file");
    return false;
    }

  return true;
}